

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

string * dotFilter(string *__return_storage_ptr__,string *name)

{
  char cVar1;
  char *pcVar2;
  stringstream ss;
  char local_1b1;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  pcVar2 = (name->_M_dataplus)._M_p;
  do {
    cVar1 = *pcVar2;
    if ((cVar1 == '<') || (cVar1 == '>')) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\\",1);
    }
    else if (cVar1 == '\0') {
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base(local_130);
      return __return_storage_ptr__;
    }
    local_1b1 = *pcVar2;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,&local_1b1,1);
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

static
std::string dotFilter(const std::string& name) {
	std::stringstream ss;

	const char* str = name.c_str();
	while (*str) {
		if (*str == '<' || *str == '>')
			ss << "\\";

		ss << *str;
		str++;
	}

	return ss.str();
}